

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> * __thiscall
tinyusdz::GeomMesh::get_normals
          (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
           *__return_storage_ptr__,GeomMesh *this,double time,TimeSampleInterpolationType interp)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *this_00;
  Attribute *pAVar3;
  value_type *this_01;
  size_type sVar4;
  AttrMeta *pAVar5;
  undefined1 local_770 [8];
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> expanded_normals;
  undefined1 local_728 [4];
  uint32_t elementSize;
  undefined1 local_6e0 [8];
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> value;
  key_type local_6c0;
  undefined1 local_6a0 [8];
  Attribute indexAttr;
  key_type local_3f0;
  undefined1 local_3d0 [8];
  vector<int,_std::allocator<int>_> indices;
  string local_3b0;
  undefined1 local_390 [8];
  GeomPrimvar primvar;
  string local_68;
  undefined1 local_48 [8];
  string err;
  TimeSampleInterpolationType interp_local;
  double time_local;
  GeomMesh *this_local;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *dst;
  
  err.field_2._M_local_buf[0xb] = '\0';
  err.field_2._12_4_ = interp;
  std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::vector
            (__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_68,"normals",
             (allocator *)((long)&primvar._interpolation.contained + 3));
  bVar1 = GPrim::has_primvar(&this->super_GPrim,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)((long)&primvar._interpolation.contained + 3))
  ;
  if (bVar1) {
    GeomPrimvar::GeomPrimvar((GeomPrimvar *)local_390);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3b0,"normals",
               (allocator *)
               ((long)&indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    bVar1 = GPrim::get_primvar(&this->super_GPrim,&local_3b0,(GeomPrimvar *)local_390,
                               (string *)local_48);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      GeomPrimvar::flatten_with_indices<tinyusdz::value::normal3f>
                ((GeomPrimvar *)local_390,time,__return_storage_ptr__,err.field_2._12_4_,
                 (string *)0x0);
    }
    err.field_2._M_local_buf[0xb] = '\x01';
    indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 1;
    GeomPrimvar::~GeomPrimvar((GeomPrimvar *)local_390);
    goto LAB_0025b5fc;
  }
  bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
          ::authored(&this->normals);
  if (bVar1) {
    bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
            ::is_connection(&this->normals);
    if (bVar1) {
      err.field_2._M_local_buf[0xb] = '\x01';
      indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
      goto LAB_0025b5fc;
    }
    bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
            ::is_blocked(&this->normals);
    if (bVar1) {
      err.field_2._M_local_buf[0xb] = '\x01';
      indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
      goto LAB_0025b5fc;
    }
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_3d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3f0,"normals:indices",
               (allocator *)
               ((long)&indexAttr._metas.stringData.
                       super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::count(&(this->super_GPrim).props,&local_3f0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&indexAttr._metas.stringData.
                       super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    if (sVar2 == 0) {
LAB_0025b44b:
      std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::vector
                ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                 local_6e0);
      TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
      ::get_value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                   *)local_728,&this->normals);
      this_01 = nonstd::optional_lite::
                optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                         *)local_728);
      bVar1 = Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
              ::get(this_01,time,
                    (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *
                    )local_6e0,err.field_2._12_4_);
      nonstd::optional_lite::
      optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
      ::~optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                   *)local_728);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        sVar4 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_3d0);
        if (sVar4 == 0) {
          std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
          operator=(__return_storage_ptr__,
                    (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *
                    )local_6e0);
        }
        else {
          pAVar5 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                   ::metas(&this->normals);
          expanded_normals.
          super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          expanded_normals.
          super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               nonstd::optional_lite::optional<unsigned_int>::value_or<int>
                         (&pAVar5->elementSize,
                          (int *)&expanded_normals.
                                  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::vector
                    ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      *)&ret.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .m_has_value);
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::normal3f>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_770,
                     (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      *)local_6e0,
                     expanded_normals.
                     super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)local_3d0,
                     (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      *)&ret.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_770);
          if (bVar1) {
            std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
            operator=(__return_storage_ptr__,
                      (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       *)&ret.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .m_has_value);
          }
          else {
            err.field_2._M_local_buf[0xb] = '\x01';
          }
          indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._1_3_ = 0;
          indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_1_ = !bVar1;
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_770);
          std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
          ~vector((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                  &ret.contained.
                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .m_has_value);
          if ((uint)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage != 0) goto LAB_0025b5c6;
        }
        indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 0;
      }
      else {
        err.field_2._M_local_buf[0xb] = '\x01';
        indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 1;
      }
LAB_0025b5c6:
      std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::~vector
                ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                 local_6e0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_6c0,"normals:indices",
                 (allocator *)
                 ((long)&value.
                         super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                ::at(&(this->super_GPrim).props,&local_6c0);
      pAVar3 = Property::get_attribute(this_00);
      Attribute::Attribute((Attribute *)local_6a0,pAVar3);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&value.
                         super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      bVar1 = Attribute::is_connection((Attribute *)local_6a0);
      if (bVar1) {
        err.field_2._M_local_buf[0xb] = '\x01';
        indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 1;
      }
      else {
        bVar1 = Attribute::get_value<std::vector<int,std::allocator<int>>>
                          ((Attribute *)local_6a0,time,
                           (vector<int,_std::allocator<int>_> *)local_3d0,err.field_2._12_4_);
        if (bVar1) {
          indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = 0;
        }
        else {
          err.field_2._M_local_buf[0xb] = '\x01';
          indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = 1;
        }
      }
      Attribute::~Attribute((Attribute *)local_6a0);
      if ((uint)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == 0) goto LAB_0025b44b;
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_3d0);
    if ((uint)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage != 0) goto LAB_0025b5fc;
  }
  err.field_2._M_local_buf[0xb] = '\x01';
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 1;
LAB_0025b5fc:
  std::__cxx11::string::~string((string *)local_48);
  if ((err.field_2._M_local_buf[0xb] & 1U) == 0) {
    std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<value::normal3f> GeomMesh::get_normals(
    double time, value::TimeSampleInterpolationType interp) const {
  std::vector<value::normal3f> dst;

  std::string err;
  if (has_primvar("normals")) {
    GeomPrimvar primvar;
    if (!get_primvar("normals", &primvar, &err)) {
      return dst;
    }

    primvar.flatten_with_indices(time, &dst, interp);
    return dst;
  } else if (normals.authored()) {
    if (normals.is_connection()) {
      // Not supported
      return dst;
    } else if (normals.is_blocked()) {
      return dst;
    }

    std::vector<int> indices;
    if (props.count("normals:indices")) {
      Attribute indexAttr = props.at("normals:indices").get_attribute();

      if (indexAttr.is_connection()) {
        // not supported.
        return dst;
      }

      if (!indexAttr.get_value(time, &indices, interp)) {
        // err
        return dst;
      }

    }

    std::vector<value::normal3f> value;
    if (!normals.get_value().value().get(time, &value, interp)) {
      return dst;
    }

    if (indices.size()) {
      uint32_t elementSize = normals.metas().elementSize.value_or(1);

      std::vector<value::normal3f> expanded_normals;
      auto ret = ExpandWithIndices(value, elementSize, indices, &expanded_normals);

      if (!ret) {
        return dst;
      }

      dst = expanded_normals;
    } else {
      dst = value;
    }
  }

  return dst;
}